

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>::
FindNextProperty(SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>
                 *this,ScriptContext *scriptContext,PropertyIndex *index,
                JavascriptString **propertyStringName,PropertyId *propertyId,
                PropertyAttributes *attributes,Type *type,DynamicType *typeToEnumerate,
                EnumeratorFlags flags,DynamicObject *instance,PropertyValueInfo *info)

{
  ushort uVar1;
  PropertyRecord *key_00;
  code *pcVar2;
  bool bVar3;
  EnumeratorFlags EVar4;
  int iVar5;
  PropertyId PVar6;
  undefined4 *puVar7;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
  *pBVar8;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *pSVar9;
  PropertyRecord **ppPVar10;
  PropertyString *this_00;
  PolymorphicInlineCache *polymorphicInlineCache;
  ScriptContext *this_01;
  PropertyRecord *local_88;
  PropertyRecord *propertyRecord;
  bool hasValue;
  DynamicTypeHandler *pDStack_78;
  SimpleDictionaryPropertyDescriptor<unsigned_short> descriptor_1;
  DynamicTypeHandler *typeHandlerToEnumerate;
  PropertyString *propertyString;
  PropertyRecord *key;
  byte *pbStack_58;
  SimpleDictionaryPropertyDescriptor<unsigned_short> descriptor;
  PropertyAttributes *attributes_local;
  PropertyId *propertyId_local;
  JavascriptString **propertyStringName_local;
  PropertyIndex *index_local;
  ScriptContext *scriptContext_local;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *this_local;
  
  pbStack_58 = attributes;
  if (propertyStringName == (JavascriptString **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x271,"(propertyStringName)","propertyStringName");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (propertyId == (PropertyId *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x272,"(propertyId)","propertyId");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (type == (Type *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x273,"(type)","type");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (typeToEnumerate == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x274,"(typeToEnumerate)","typeToEnumerate");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if ((DynamicType *)type == typeToEnumerate) {
    while( true ) {
      uVar1 = *index;
      pBVar8 = Memory::
               WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>_>
               ::operator->(&this->propertyMap);
      iVar5 = JsUtil::
              BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
              ::Count(pBVar8);
      if (iVar5 <= (int)(uint)uVar1) break;
      pBVar8 = Memory::
               WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>_>
               ::operator->(&this->propertyMap);
      pSVar9 = JsUtil::
               BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
               ::GetValueAt(pBVar8,(uint)*index);
      key._4_4_ = *pSVar9;
      if (((uint)key._4_4_ & 0x1800) == 0) {
        EVar4 = Js::operator&(flags,EnumNonEnumerable);
        bVar3 = operator!(EVar4);
        if ((!bVar3) || (((uint)key._4_4_ & 0x100) != 0)) {
          pBVar8 = Memory::
                   WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>_>
                   ::operator->(&this->propertyMap);
          ppPVar10 = JsUtil::
                     BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
                     ::GetKeyAt(pBVar8,(uint)*index);
          key_00 = *ppPVar10;
          EVar4 = Js::operator&(flags,EnumSymbols);
          bVar3 = operator!(EVar4);
          if ((!bVar3) || (bVar3 = TMapKey_IsSymbol(key_00,scriptContext), !bVar3)) {
            if (pbStack_58 != (byte *)0x0) {
              *pbStack_58 = key._5_1_;
            }
            PVar6 = DynamicTypeHandler::TMapKey_GetPropertyId(scriptContext,key_00);
            *propertyId = PVar6;
            this_00 = ScriptContext::GetPropertyString(scriptContext,*propertyId);
            *propertyStringName = &this_00->super_JavascriptString;
            if (((uint)key._4_4_ & 0x400) == 0) {
              PropertyValueInfo::SetNoCache(info,&instance->super_RecyclableObject);
            }
            else {
              polymorphicInlineCache = PropertyString::GetLdElemInlineCache(this_00);
              PropertyValueInfo::SetCacheInfo<Js::PropertyString>
                        (info,this_00,polymorphicInlineCache,false);
              SetPropertyValueInfo
                        (this,info,&instance->super_RecyclableObject,
                         (SimpleDictionaryPropertyDescriptor<unsigned_short> *)((long)&key + 4));
            }
            return 1;
          }
        }
      }
      *index = *index + 1;
    }
    PropertyValueInfo::SetNoCache(info,&instance->super_RecyclableObject);
  }
  else {
    pDStack_78 = DynamicType::GetTypeHandler(typeToEnumerate);
    while (iVar5 = (*pDStack_78->_vptr_DynamicTypeHandler[10])
                             (pDStack_78,scriptContext,index,propertyStringName,propertyId,
                              pbStack_58,typeToEnumerate,typeToEnumerate,(uint)flags,instance,info),
          iVar5 != 0) {
      SimpleDictionaryPropertyDescriptor<unsigned_short>::SimpleDictionaryPropertyDescriptor
                ((SimpleDictionaryPropertyDescriptor<unsigned_short> *)((long)&propertyRecord + 4));
      propertyRecord._3_1_ = false;
      if (*propertyId == -1) {
        if (*propertyStringName != (JavascriptString *)0x0) {
          pBVar8 = Memory::
                   WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>_>
                   ::operator->(&this->propertyMap);
          propertyRecord._3_1_ =
               JsUtil::
               BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
               ::TryGetValue<Js::JavascriptString*>
                         ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                           *)pBVar8,propertyStringName,
                          (SimpleDictionaryPropertyDescriptor<unsigned_short> *)
                          ((long)&propertyRecord + 4));
        }
      }
      else {
        this_01 = Js::Type::GetScriptContext(type);
        local_88 = ScriptContext::GetPropertyName(this_01,*propertyId);
        EVar4 = Js::operator&(flags,EnumSymbols);
        bVar3 = operator!(EVar4);
        if ((bVar3) && (bVar3 = PropertyRecord::IsSymbol(local_88), bVar3)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                      ,0x2b7,
                                      "(!!(flags & EnumeratorFlags::EnumSymbols) || !propertyRecord->IsSymbol())"
                                      ,
                                      "typeHandlerToEnumerate->FindNextProperty call above should not have returned us a symbol if we are not enumerating symbols"
                                     );
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        pBVar8 = Memory::
                 WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>_>
                 ::operator->(&this->propertyMap);
        propertyRecord._3_1_ =
             JsUtil::
             BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
             ::TryGetValue<Js::PropertyRecord_const*>
                       ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                         *)pBVar8,&local_88,
                        (SimpleDictionaryPropertyDescriptor<unsigned_short> *)
                        ((long)&propertyRecord + 4));
      }
      if (((bool)propertyRecord._3_1_ != false) && ((propertyRecord._5_1_ & 0x18) == 0)) {
        EVar4 = Js::operator&(flags,EnumNonEnumerable);
        bVar3 = operator!(EVar4);
        if ((!bVar3) || ((propertyRecord._5_1_ & 1) != 0)) {
          if (pbStack_58 != (byte *)0x0) {
            *pbStack_58 = propertyRecord._5_1_;
          }
          PropertyValueInfo::SetNoCache(info,&instance->super_RecyclableObject);
          return 1;
        }
      }
      *index = *index + 1;
    }
    PropertyValueInfo::SetNoCache(info,&instance->super_RecyclableObject);
  }
  return 0;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::FindNextProperty(ScriptContext* scriptContext, PropertyIndex& index, JavascriptString** propertyStringName,
        PropertyId* propertyId, PropertyAttributes* attributes, Type* type, DynamicType *typeToEnumerate, EnumeratorFlags flags, DynamicObject* instance, PropertyValueInfo* info)
    {
        Assert(propertyStringName);
        Assert(propertyId);
        Assert(type);
        Assert(typeToEnumerate);

        if(type == typeToEnumerate)
        {
            for( ; index < propertyMap->Count(); ++index )
            {
                SimpleDictionaryPropertyDescriptor<TPropertyIndex> descriptor(propertyMap->GetValueAt(index));
                if( !(descriptor.Attributes & (PropertyDeleted | PropertyLetConstGlobal)) && (!!(flags & EnumeratorFlags::EnumNonEnumerable) || (descriptor.Attributes & PropertyEnumerable)))
                {
                    TMapKey key = propertyMap->GetKeyAt(index);

                    // Skip this property if it is a symbol and we are not including symbol properties
                    if (!(flags & EnumeratorFlags::EnumSymbols) && TMapKey_IsSymbol(key, scriptContext))
                    {
                        continue;
                    }

                    if (attributes != nullptr)
                    {
                        *attributes = descriptor.Attributes;
                    }

                    *propertyId = TMapKey_GetPropertyId(scriptContext, key);
                    PropertyString* propertyString = scriptContext->GetPropertyString(*propertyId);
                    *propertyStringName = propertyString;
                    if (descriptor.Attributes & PropertyWritable)
                    {
                        PropertyValueInfo::SetCacheInfo(info, propertyString, propertyString->GetLdElemInlineCache(), false);
                        SetPropertyValueInfo(info, instance, &descriptor);
                    }
                    else
                    {
                        PropertyValueInfo::SetNoCache(info, instance);
                    }
                    return TRUE;
                }
            }
            PropertyValueInfo::SetNoCache(info, instance);

            return FALSE;
        }

        // Need to enumerate a different type than the current one. This is because type snapshot enumerate is enabled and the
        // object's type changed since enumeration began, so need to enumerate properties of the initial type.
        DynamicTypeHandler *const typeHandlerToEnumerate = typeToEnumerate->GetTypeHandler();
        for(
            ;
            typeHandlerToEnumerate->FindNextProperty(
                scriptContext,
                index,
                propertyStringName,
                propertyId,
                attributes,
                typeToEnumerate,
                typeToEnumerate,
                flags,
                instance,
                info);
            ++index)
        {
            SimpleDictionaryPropertyDescriptor<TPropertyIndex> descriptor;
            bool hasValue = false;
            if (*propertyId != Constants::NoProperty)
            {
                PropertyRecord const* propertyRecord = type->GetScriptContext()->GetPropertyName(*propertyId);

                AssertMsg(!!(flags & EnumeratorFlags::EnumSymbols) || !propertyRecord->IsSymbol(),
                    "typeHandlerToEnumerate->FindNextProperty call above should not have returned us a symbol if we are not enumerating symbols");

                hasValue = propertyMap->TryGetValue(propertyRecord, &descriptor);
            }
            else if (*propertyStringName != nullptr)
            {
                hasValue = propertyMap->TryGetValue(*propertyStringName, &descriptor);
            }

            if (hasValue &&
                !(descriptor.Attributes & (PropertyDeleted | PropertyLetConstGlobal)) &&
                (!!(flags & EnumeratorFlags::EnumNonEnumerable) || descriptor.Attributes & PropertyEnumerable))
            {
                if (attributes != nullptr)
                {
                    *attributes = descriptor.Attributes;
                }
                PropertyValueInfo::SetNoCache(info, instance);
                return TRUE;
            }
        }
        PropertyValueInfo::SetNoCache(info, instance);

        return FALSE;
    }